

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getIntergroupVector
          (Vector3d *__return_storage_ptr__,ForceMatrixDecomposition *this,int cg1,int cg2)

{
  pointer pVVar1;
  Vector<double,_3U> VStack_38;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  pVVar1 = (((this->super_ForceDecomposition).snap_)->cgData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  operator-(&VStack_38,&pVVar1[cg2].super_Vector<double,_3U>,&pVVar1[cg1].super_Vector<double,_3U>);
  Vector3<double>::operator=(__return_storage_ptr__,&VStack_38);
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector((this->super_ForceDecomposition).snap_,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d ForceMatrixDecomposition::getIntergroupVector(int cg1, int cg2) {
    Vector3d d;
#ifdef IS_MPI
    d = cgColData.position[cg2] - cgRowData.position[cg1];
#else
    d = snap_->cgData.position[cg2] - snap_->cgData.position[cg1];
#endif

    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }